

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O0

void wasm::ReReloop::BreakTask::handle(ReReloop *parent,Break *curr)

{
  Block *from;
  Block *pBVar1;
  Block *after;
  Block *before;
  Break *curr_local;
  ReReloop *parent_local;
  
  from = getCurrCFGBlock(parent);
  pBVar1 = getBreakTarget(parent,(Name)(curr->name).super_IString.str);
  addBranch(parent,from,pBVar1,curr->condition);
  if (curr->condition == (Expression *)0x0) {
    stopControlFlow(parent);
  }
  else {
    pBVar1 = startCFGBlock(parent);
    addBranch(parent,from,pBVar1,(Expression *)0x0);
  }
  return;
}

Assistant:

static void handle(ReReloop& parent, Break* curr) {
      // add the branch. note how if the condition is false, it is the right
      // value there as well
      auto* before = parent.getCurrCFGBlock();
      parent.addBranch(
        before, parent.getBreakTarget(curr->name), curr->condition);
      if (curr->condition) {
        auto* after = parent.startCFGBlock();
        parent.addBranch(before, after);
      } else {
        parent.stopControlFlow();
      }
    }